

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make_constant<int,int&>(any *this,int *args)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_0033efa8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<cs_impl::member_visitor>::allocator + DAT_0033efa8 * 8);
    DAT_0033efa8 = DAT_0033efa8 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_0032daf0;
  *(int *)&pbVar1[1]._vptr_baseHolder = *args;
  if ((DAT_00344820 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_00344820];
    DAT_00344820 = DAT_00344820 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 2;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}